

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationData::getEquivalentScripts
          (CollationData *this,int32_t script,int32_t *dest,int32_t capacity,UErrorCode *errorCode)

{
  uint16_t uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint16_t *puVar5;
  ulong uVar6;
  
  iVar2 = 0;
  if ((-1 < script) && (iVar2 = 0, *errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    iVar4 = this->numScripts;
    if (script < iVar4) {
      puVar5 = this->scriptsIndex;
      uVar6 = (ulong)(uint)script;
    }
    else {
      if ((script & 0x7ffffff8U) != 0x1000) {
        return 0;
      }
      puVar5 = this->scriptsIndex;
      uVar6 = (ulong)(script + iVar4 + -0x1000);
    }
    uVar1 = puVar5[uVar6];
    if (uVar1 != 0) {
      if (0xfff < (uint)script) {
        if (capacity < 1) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          *dest = script;
        }
        return 1;
      }
      if (iVar4 < 1) {
        iVar2 = 0;
      }
      else {
        lVar3 = 0;
        iVar2 = 0;
        do {
          if (uVar1 == puVar5[lVar3]) {
            if (iVar2 < capacity) {
              dest[iVar2] = (int32_t)lVar3;
              iVar4 = this->numScripts;
            }
            iVar2 = iVar2 + 1;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar4);
      }
      if (capacity < iVar2) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
    }
  }
  return iVar2;
}

Assistant:

int32_t
CollationData::getEquivalentScripts(int32_t script,
                                    int32_t dest[], int32_t capacity,
                                    UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    int32_t index = getScriptIndex(script);
    if(index == 0) { return 0; }
    if(script >= UCOL_REORDER_CODE_FIRST) {
        // Special groups have no aliases.
        if(capacity > 0) {
            dest[0] = script;
        } else {
            errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        return 1;
    }

    int32_t length = 0;
    for(int32_t i = 0; i < numScripts; ++i) {
        if(scriptsIndex[i] == index) {
            if(length < capacity) {
                dest[length] = i;
            }
            ++length;
        }
    }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    return length;
}